

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O2

void __thiscall duckdb::ListConcatInputData::~ListConcatInputData(ListConcatInputData *this)

{
  UnifiedVectorFormat::~UnifiedVectorFormat(&this->child_vdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&this->vdata);
  return;
}

Assistant:

ListConcatInputData(Vector &input, Vector &child_vec) : input(input), child_vec(child_vec) {
	}